

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BreakpointProbe.cpp
# Opt level: O2

bool __thiscall Js::BreakpointProbe::Uninstall(BreakpointProbe *this,ScriptContext *pScriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebugDocument *this_00;
  
  if (this->functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/BreakpointProbe.cpp"
                                ,0x1b,"(this->functionBody)","this->functionBody");
    if (!bVar2) goto LAB_007df244;
    *puVar3 = 0;
    if (this->functionBody == (FunctionBody *)0x0) {
      return true;
    }
  }
  this_00 = this->debugDocument;
  if (this_00 == (DebugDocument *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/BreakpointProbe.cpp"
                                ,0x1f,"(this->debugDocument)","this->debugDocument");
    if (!bVar2) {
LAB_007df244:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = this->debugDocument;
  }
  DebugDocument::RemoveBreakpointProbe(this_00,this);
  bVar2 = FunctionBody::UninstallProbe(this->functionBody,this->byteOffset);
  return bVar2;
}

Assistant:

bool BreakpointProbe::Uninstall(ScriptContext* pScriptContext)
    {
        Assert(this->functionBody);

        if (this->functionBody)
        {
            Assert(this->debugDocument);
            this->debugDocument->RemoveBreakpointProbe(this);

            return functionBody->UninstallProbe(byteOffset);
        }

        return true;
    }